

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int memjrnlTruncate(sqlite3_file *pJfd,sqlite_int64 size)

{
  bool bVar1;
  long lVar2;
  MemJournal *p;
  sqlite3_file sVar3;
  sqlite3_file sVar4;
  
  if ((long)pJfd[3].pMethods <= size) {
    return 0;
  }
  if (size == 0) {
    sVar4.pMethods = (sqlite3_io_methods *)(pJfd + 2);
    sVar3.pMethods = (sqlite3_io_methods *)0x0;
  }
  else {
    sVar3.pMethods = (sqlite3_io_methods *)(pJfd + 2);
    lVar2 = (long)*(int *)&pJfd[1].pMethods;
    do {
      sVar3.pMethods = *sVar3.pMethods;
      if (sVar3.pMethods == (sqlite3_io_methods *)0x0) break;
      bVar1 = lVar2 < size;
      lVar2 = lVar2 + *(int *)&pJfd[1].pMethods;
    } while (bVar1);
    sVar4.pMethods = sVar3.pMethods;
    if (sVar3.pMethods == (sqlite3_io_methods *)0x0) {
      sVar3.pMethods = (sqlite3_io_methods *)0x0;
      goto LAB_0015bf37;
    }
  }
  memjrnlFreeChunks(*(FileChunk **)sVar4.pMethods);
  *(undefined8 *)sVar4.pMethods = 0;
LAB_0015bf37:
  pJfd[4].pMethods = sVar3.pMethods;
  pJfd[3].pMethods = (sqlite3_io_methods *)size;
  pJfd[5].pMethods = (sqlite3_io_methods *)0x0;
  pJfd[6].pMethods = (sqlite3_io_methods *)0x0;
  return 0;
}

Assistant:

static int memjrnlTruncate(sqlite3_file *pJfd, sqlite_int64 size){
  MemJournal *p = (MemJournal *)pJfd;
  assert( p->endpoint.pChunk==0 || p->endpoint.pChunk->pNext==0 );
  if( size<p->endpoint.iOffset ){
    FileChunk *pIter = 0;
    if( size==0 ){
      memjrnlFreeChunks(p->pFirst);
      p->pFirst = 0;
    }else{
      i64 iOff = p->nChunkSize;
      for(pIter=p->pFirst; ALWAYS(pIter) && iOff<size; pIter=pIter->pNext){
        iOff += p->nChunkSize;
      }
      if( ALWAYS(pIter) ){
        memjrnlFreeChunks(pIter->pNext);
        pIter->pNext = 0;
      }
    }

    p->endpoint.pChunk = pIter;
    p->endpoint.iOffset = size;
    p->readpoint.pChunk = 0;
    p->readpoint.iOffset = 0;
  }
  return SQLITE_OK;
}